

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O0

int verify_miniscript_wrapper_d(miniscript_node_t *node,miniscript_node_t *parent)

{
  uint uVar1;
  uint32_t need_type;
  uint32_t x_prop;
  miniscript_node_t *parent_local;
  miniscript_node_t *node_local;
  
  uVar1 = node->type_properties;
  if ((uVar1 & 0x102) == 0x102) {
    node->type_properties = node->type_properties & 0xfffffefd;
    node->type_properties = node->type_properties | 1;
    node->type_properties = node->type_properties & 0x1800f;
    node->type_properties = node->type_properties | 0x21c00;
    if ((uVar1 & 0x100) != 0) {
      node->type_properties = node->type_properties | 0x200;
    }
    if ((uVar1 & 0x4000) != 0) {
      node->type_properties = node->type_properties & 0xffffbfff;
      node->type_properties = node->type_properties | 0x2000;
    }
    node_local._4_4_ = 0;
  }
  else {
    node_local._4_4_ = -2;
  }
  return node_local._4_4_;
}

Assistant:

static int verify_miniscript_wrapper_d(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop = node->type_properties;
    uint32_t need_type = MINISCRIPT_TYPE_V | MINISCRIPT_PROPERTY_Z;
    (void)parent;

    if ((x_prop & need_type) != need_type)
        return WALLY_EINVAL;

    node->type_properties &= ~need_type;
    node->type_properties |= MINISCRIPT_TYPE_B;
    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_M | MINISCRIPT_PROPERTY_S;
    node->type_properties |= MINISCRIPT_PROPERTY_N | MINISCRIPT_PROPERTY_U |
                             MINISCRIPT_PROPERTY_D | MINISCRIPT_PROPERTY_X;
    if (x_prop & MINISCRIPT_PROPERTY_Z)
        node->type_properties |= MINISCRIPT_PROPERTY_O;
    if (x_prop & MINISCRIPT_PROPERTY_F) {
        node->type_properties &= ~MINISCRIPT_PROPERTY_F;
        node->type_properties |= MINISCRIPT_PROPERTY_E;
    }
    return WALLY_OK;
}